

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSRGBDecodeTests.cpp
# Opt level: O2

int __thiscall
deqp::gles31::Functional::SRGBDecodeTests::init(SRGBDecodeTests *this,EVP_PKEY_CTX *ctx)

{
  TextureFormat internalFormat;
  undefined8 uVar1;
  TestNode *node;
  SRGBTestCase *pSVar2;
  undefined8 extraout_RAX;
  long lVar3;
  TextureFormat aTStack_78 [2];
  TestGroupConfig testGroupConfigList [2];
  
  testGroupConfigList[0].name = "srgba8";
  testGroupConfigList[0].description = "srgb decode tests using srgba internal format";
  uVar1 = 0x30000000c;
  testGroupConfigList[0].internalFormat.order = sRGBA;
  testGroupConfigList[0].internalFormat.type = UNORM_INT8;
  testGroupConfigList[1].name = "sr8";
  testGroupConfigList[1].description = "srgb decode tests using sr8 internal format";
  testGroupConfigList[1].internalFormat.order = sR;
  testGroupConfigList[1].internalFormat.type = UNORM_INT8;
  for (lVar3 = 0x10; lVar3 != 0x40; lVar3 = lVar3 + 0x18) {
    aTStack_78[1].order = 0x463dfd;
    aTStack_78[1].type = SNORM_INT8;
    node = (TestNode *)operator_new(0x70);
    aTStack_78[1].order = 0x463e16;
    aTStack_78[1].type = SNORM_INT8;
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)node,
               (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
               *(char **)((long)&aTStack_78[0].order + lVar3),
               *(char **)((long)testGroupConfigList + lVar3 + -8));
    aTStack_78[1].order = 0x463e21;
    aTStack_78[1].type = SNORM_INT8;
    tcu::TestNode::addChild((TestNode *)this,node);
    aTStack_78[1].order = 0x463e2b;
    aTStack_78[1].type = SNORM_INT8;
    pSVar2 = (SRGBTestCase *)operator_new(0x158);
    internalFormat = *(TextureFormat *)((long)&testGroupConfigList[0].name + lVar3);
    aTStack_78[1].order = 0x463e4f;
    aTStack_78[1].type = SNORM_INT8;
    anon_unknown_0::SRGBTestCase::SRGBTestCase
              (pSVar2,(this->super_TestCaseGroup).m_context,"skipped",
               "testing for sRGB color values with sRGB texture decoding skipped",internalFormat);
    (pSVar2->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__SRGBTestCase_00a0dec0;
    aTStack_78[1].order = 0x463e65;
    aTStack_78[1].type = SNORM_INT8;
    tcu::TestNode::addChild(node,(TestNode *)pSVar2);
    aTStack_78[1].order = 0x463e6f;
    aTStack_78[1].type = SNORM_INT8;
    pSVar2 = (SRGBTestCase *)operator_new(0x158);
    aTStack_78[1].order = 0x463e8f;
    aTStack_78[1].type = SNORM_INT8;
    anon_unknown_0::SRGBTestCase::SRGBTestCase
              (pSVar2,(this->super_TestCaseGroup).m_context,"enabled",
               "testing for linear color values with sRGB texture decoding enabled",internalFormat);
    (pSVar2->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__SRGBTestCase_00a0df90;
    aTStack_78[1].order = 0x463ea5;
    aTStack_78[1].type = SNORM_INT8;
    tcu::TestNode::addChild(node,(TestNode *)pSVar2);
    aTStack_78[1].order = 0x463eaf;
    aTStack_78[1].type = SNORM_INT8;
    pSVar2 = (SRGBTestCase *)operator_new(0x158);
    aTStack_78[1].order = 0x463ecf;
    aTStack_78[1].type = SNORM_INT8;
    anon_unknown_0::SRGBTestCase::SRGBTestCase
              (pSVar2,(this->super_TestCaseGroup).m_context,"texel_fetch",
               "testing for linear color values with sRGB texture decoding skipped",internalFormat);
    (pSVar2->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__SRGBTestCase_00a0dff8;
    aTStack_78[1].order = 0x463ee5;
    aTStack_78[1].type = SNORM_INT8;
    tcu::TestNode::addChild(node,(TestNode *)pSVar2);
    aTStack_78[1].order = 0x463eef;
    aTStack_78[1].type = SNORM_INT8;
    pSVar2 = (SRGBTestCase *)operator_new(0x158);
    aTStack_78[1].order = 0x463f0f;
    aTStack_78[1].type = SNORM_INT8;
    anon_unknown_0::SRGBTestCase::SRGBTestCase
              (pSVar2,(this->super_TestCaseGroup).m_context,"conversion_gpu",
               "sampling linear values and performing conversion on the gpu",internalFormat);
    (pSVar2->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__SRGBTestCase_00a0e060;
    aTStack_78[1].order = 0x463f25;
    aTStack_78[1].type = SNORM_INT8;
    tcu::TestNode::addChild(node,(TestNode *)pSVar2);
    aTStack_78[1].order = 0x463f2f;
    aTStack_78[1].type = SNORM_INT8;
    pSVar2 = (SRGBTestCase *)operator_new(0x158);
    aTStack_78[1].order = 0x463f4f;
    aTStack_78[1].type = SNORM_INT8;
    anon_unknown_0::SRGBTestCase::SRGBTestCase
              (pSVar2,(this->super_TestCaseGroup).m_context,"toggled",
               "toggle the sRGB decoding between draw calls",internalFormat);
    (pSVar2->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__SRGBTestCase_00a0e0c8;
    aTStack_78[1].order = 0x463f65;
    aTStack_78[1].type = SNORM_INT8;
    tcu::TestNode::addChild(node,(TestNode *)pSVar2);
    aTStack_78[1].order = 0x463f6f;
    aTStack_78[1].type = SNORM_INT8;
    pSVar2 = (SRGBTestCase *)operator_new(0x158);
    aTStack_78[1].order = 0x463f8f;
    aTStack_78[1].type = SNORM_INT8;
    anon_unknown_0::SRGBTestCase::SRGBTestCase
              (pSVar2,(this->super_TestCaseGroup).m_context,"multiple_textures",
               "upload multiple textures with different sRGB decode values and sample",
               internalFormat);
    (pSVar2->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__SRGBTestCase_00a0e130;
    aTStack_78[1].order = 0x463fa5;
    aTStack_78[1].type = SNORM_INT8;
    tcu::TestNode::addChild(node,(TestNode *)pSVar2);
    aTStack_78[1].order = 0x463faf;
    aTStack_78[1].type = SNORM_INT8;
    pSVar2 = (SRGBTestCase *)operator_new(0x158);
    aTStack_78[1].order = 0x463fcb;
    aTStack_78[1].type = SNORM_INT8;
    anon_unknown_0::SRGBTestCase::SRGBTestCase
              (pSVar2,(this->super_TestCaseGroup).m_context,"using_sampler",
               "testing that sampler object takes priority over texture state",internalFormat);
    (pSVar2->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__SRGBTestCase_00a0e198;
    aTStack_78[1].order = 0x463fe1;
    aTStack_78[1].type = SNORM_INT8;
    tcu::TestNode::addChild(node,(TestNode *)pSVar2);
    uVar1 = extraout_RAX;
  }
  return (int)uVar1;
}

Assistant:

void SRGBDecodeTests::init (void)
{
	const TestGroupConfig testGroupConfigList[] =
	{
		TestGroupConfig("srgba8",	"srgb decode tests using srgba internal format",	tcu::TextureFormat(tcu::TextureFormat::sRGBA, tcu::TextureFormat::UNORM_INT8)),
		TestGroupConfig("sr8",		"srgb decode tests using sr8 internal format",		tcu::TextureFormat(tcu::TextureFormat::sR, tcu::TextureFormat::UNORM_INT8))
	};

	// create groups for all desired internal formats, adding test cases to each
	for (std::size_t idx = 0; idx < DE_LENGTH_OF_ARRAY(testGroupConfigList); idx++)
	{
		tcu::TestCaseGroup* const testGroup = new tcu::TestCaseGroup(m_testCtx, testGroupConfigList[idx].name, testGroupConfigList[idx].description);
		tcu::TestNode::addChild(testGroup);

		testGroup->addChild(new TextureDecodeSkippedCase		(m_context, "skipped",			"testing for sRGB color values with sRGB texture decoding skipped",		testGroupConfigList[idx].internalFormat));
		testGroup->addChild(new TextureDecodeEnabledCase		(m_context, "enabled",			"testing for linear color values with sRGB texture decoding enabled",	testGroupConfigList[idx].internalFormat));
		testGroup->addChild(new TexelFetchDecodeSkippedcase		(m_context, "texel_fetch",		"testing for linear color values with sRGB texture decoding skipped",	testGroupConfigList[idx].internalFormat));
		testGroup->addChild(new GPUConversionDecodeEnabledCase	(m_context, "conversion_gpu",	"sampling linear values and performing conversion on the gpu",			testGroupConfigList[idx].internalFormat));
		testGroup->addChild(new DecodeToggledCase				(m_context, "toggled",			"toggle the sRGB decoding between draw calls",							testGroupConfigList[idx].internalFormat));
		testGroup->addChild(new DecodeMultipleTexturesCase		(m_context, "multiple_textures","upload multiple textures with different sRGB decode values and sample",testGroupConfigList[idx].internalFormat));
		testGroup->addChild(new DecodeSamplerCase				(m_context, "using_sampler",	"testing that sampler object takes priority over texture state",		testGroupConfigList[idx].internalFormat));
	}
}